

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O3

int adios2::utils::readVarBlock<std::__cxx11::string>
              (Engine *fp,IO *io,
              Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *variable,size_t step,size_t blockid,Dims *Count,Dims *Start)

{
  pointer puVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t uVar9;
  size_type __new_size;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint64_t uVar16;
  ulong uVar17;
  uint uVar18;
  bool bVar19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dataV;
  Dims startv;
  Dims countv;
  uint64_t s [16];
  uint64_t c [16];
  uint64_t count_t [16];
  uint64_t readn [16];
  uint64_t start_t [16];
  int ndigits_dims [32];
  ulong local_428;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e8;
  long local_3d0;
  long local_3c8;
  Engine *local_3c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3a0;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_388;
  uint64_t local_358 [17];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2d0;
  uint64_t local_2b8 [15];
  ulong uStack_240;
  ulong local_238 [15];
  ulong uStack_1c0;
  uint64_t auStack_1b8 [15];
  ulong uStack_140;
  uint64_t local_138 [16];
  int local_b8 [34];
  
  local_3e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = *(ulong *)(variable + 0x30);
  local_3c0 = fp;
  if (timestep == '\x01') {
    uVar15 = *(long *)(variable + 0x90) - *(long *)(variable + 0x88);
LAB_00125288:
    bVar4 = false;
    iVar6 = 0;
  }
  else {
    uVar5 = adios2::core::VariableBase::GetAvailableStepsCount();
    uVar15 = *(long *)(variable + 0x90) - *(long *)(variable + 0x88);
    if ((int)uVar5 < 2) goto LAB_00125288;
    uVar17 = (ulong)(uVar5 & 0x7fffffff & (uint)(istart >> 0x3f)) + istart;
    lVar11 = (((ulong)(uVar5 & 0x7fffffff) + icount) - uVar17) + 1;
    if (-1 < icount) {
      lVar11 = icount;
    }
    if (2 < verbose) {
      printf("    time: st=%lu ct=%lu\n",uVar17,lVar11);
    }
    if ((step < uVar17) || (lVar11 + uVar17 <= step)) goto LAB_00125a99;
    iVar6 = 1;
    bVar4 = true;
  }
  uVar5 = (uint)(uVar15 >> 3);
  if ((int)uVar5 < 1) {
    bVar19 = true;
    local_428 = 1;
  }
  else {
    local_428 = 1;
    uVar15 = 0;
    bVar19 = false;
    do {
      lVar11 = uVar15 * 8 + (ulong)(uint)(iVar6 << 3);
      uVar17 = *(ulong *)((long)&istart + lVar11);
      puVar1 = (Count->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)uVar17 < 0) {
        uVar17 = uVar17 + puVar1[uVar15];
      }
      uVar14 = *(ulong *)((long)&icount + lVar11);
      uVar8 = puVar1[uVar15];
      uVar13 = (uVar14 - uVar17) + 1 + uVar8;
      if (-1 < (long)uVar14) {
        uVar13 = uVar14;
      }
      if (uVar8 < uVar17) {
        bVar19 = true;
      }
      uVar14 = uVar8 - uVar17;
      if (uVar13 < uVar8 - uVar17) {
        uVar14 = uVar13;
      }
      if (uVar8 < uVar17) {
        uVar14 = uVar13;
      }
      if (2 < verbose) {
        printf("    j=%d, st=%lu ct=%lu\n",uVar15 & 0xffffffff,uVar17,uVar14);
      }
      (&uStack_140)[uVar15 + 1] = uVar17;
      (&uStack_240)[uVar15 + 1] = uVar14;
      local_428 = local_428 * uVar14;
      if (1 < verbose) {
        printf("    s[%d]=%lu, c[%d]=%lu, n=%lu\n",uVar15 & 0xffffffff,uVar17,uVar15 & 0xffffffff,
               uVar14,local_428);
      }
      uVar15 = uVar15 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar15);
    bVar19 = !bVar19;
  }
  if (1 < verbose) {
    printf(" total size of data to read = %lu\n",local_428 * uVar7);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_2d0,Count);
  print_slice_info((VariableBase *)variable,false,local_138,local_238,&local_2d0);
  if (local_2d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (bVar19) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar7;
    uVar7 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xa00000)) / auVar3,0);
    if (local_428 < uVar7) {
      uVar7 = local_428;
    }
    if (1 < verbose) {
      puts("Read size strategy:");
    }
    uVar18 = uVar5 - 1;
    if ((int)uVar5 < 1) {
      uVar15 = 1;
      lVar11 = 1;
    }
    else {
      lVar11 = 1;
      uVar15 = 1;
      uVar17 = (ulong)uVar18;
      do {
        if (uVar15 < uVar7) {
          uVar8 = uVar7 / (uVar15 & 0xffffffff);
          uVar14 = (&uStack_240)[uVar17 + 1];
          if (uVar8 < (&uStack_240)[uVar17 + 1]) {
            uVar14 = uVar8;
          }
          (&uStack_1c0)[uVar17 + 1] = uVar14;
        }
        else {
          (&uStack_1c0)[uVar17 + 1] = 1;
          uVar14 = 1;
        }
        if (1 < verbose) {
          printf("    dim %d: read %lu elements\n",uVar17 & 0xffffffff,uVar14);
        }
        uVar15 = uVar15 * (&uStack_240)[uVar17 + 1];
        lVar11 = lVar11 * uVar14;
        bVar19 = 0 < (long)uVar17;
        uVar17 = uVar17 - 1;
      } while (bVar19);
    }
    if (1 < verbose) {
      printf("    read %lu elements at once, %lu in total (nelems=%lu)\n",lVar11,uVar15,local_428);
    }
    if (0 < (int)uVar5) {
      uVar7 = 0;
      do {
        uVar16 = (&uStack_140)[uVar7 + 1];
        local_358[uVar7] = uVar16;
        local_2b8[uVar7] = (&uStack_1c0)[uVar7 + 1];
        iVar6 = snprintf(ndigits(unsigned_long)::digitstr,0x20,"%zu",
                         (uVar16 - 1) + (&uStack_240)[uVar7 + 1]);
        local_b8[uVar7] = iVar6;
        uVar7 = uVar7 + 1;
      } while ((uVar5 & 0x7fffffff) != uVar7);
    }
    if (local_428 != 0) {
      local_3c8 = (long)(int)uVar18;
      uVar15 = (ulong)(uVar5 & 0x7fffffff);
      local_3d0 = (ulong)(uVar5 - 2) + 1;
      uVar7 = 0;
      do {
        if ((int)uVar5 < 1) {
          uVar16 = local_358[local_3c8];
          lVar11 = 1;
        }
        else {
          lVar11 = 1;
          uVar17 = 0;
          do {
            lVar11 = lVar11 * local_2b8[uVar17];
            uVar17 = uVar17 + 1;
          } while (uVar15 != uVar17);
          uVar16 = local_358[local_3c8];
          if (1 < (int)uVar5) {
            uVar9 = local_2b8[local_3c8];
            lVar10 = local_3d0;
            do {
              uVar16 = uVar16 + local_358[lVar10 + -1] * uVar9;
              uVar9 = uVar9 * local_2b8[lVar10 + -1];
              lVar12 = lVar10 + -1;
              bVar19 = 0 < lVar10;
              lVar10 = lVar12;
            } while (lVar12 != 0 && bVar19);
          }
        }
        if (2 < verbose) {
          printf("adios_read_var name=%s ",*(undefined8 *)(variable + 8));
          printf("%s = { ","  start");
          if ((int)uVar5 < 1) {
            putchar(0x7d);
            printf("%s = { ","  count");
          }
          else {
            uVar17 = 0;
            do {
              printf("%lu ",local_358[uVar17]);
              uVar17 = uVar17 + 1;
            } while (uVar15 != uVar17);
            putchar(0x7d);
            printf("%s = { ","  count");
            if (0 < (int)uVar5) {
              uVar17 = 0;
              do {
                printf("%lu ",local_2b8[uVar17]);
                uVar17 = uVar17 + 1;
              } while (uVar15 != uVar17);
            }
          }
          putchar(0x7d);
          printf("  read %lu elems\n",lVar11);
        }
        if (1 < verbose) {
          printf("    read block %zu from offset %lu nelems %lu)\n",blockid,uVar16,lVar11);
        }
        adios2::helper::Uint64ArrayToSizetVector((ulong)&local_3b8,(ulong *)(long)(int)uVar5);
        adios2::helper::Uint64ArrayToSizetVector((ulong)&local_3a0,(ulong *)(long)(int)uVar5);
        if ((*(int *)(variable + 0x40) == 2) && (0 < (int)uVar5)) {
          puVar1 = (Start->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar17 = 0;
          do {
            local_3b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar17] =
                 local_3b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar17] + puVar1[uVar17];
            uVar17 = uVar17 + 1;
          } while (uVar15 != uVar17);
        }
        if (2 < verbose) {
          printf("set selection: ");
          printf("%s = { ","  start");
          if ((int)uVar5 < 1) {
            putchar(0x7d);
            printf("%s = { ","  count");
          }
          else {
            uVar17 = 0;
            do {
              printf("%zu ",local_3b8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar17]);
              uVar17 = uVar17 + 1;
            } while (uVar15 != uVar17);
            putchar(0x7d);
            printf("%s = { ","  count");
            if (0 < (int)uVar5) {
              uVar17 = 0;
              do {
                printf("%zu ",local_3a0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar17]);
                uVar17 = uVar17 + 1;
              } while (uVar15 != uVar17);
            }
          }
          putchar(0x7d);
          putchar(10);
        }
        if (variable[0x54] ==
            (Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             )0x0) {
          if (*(int *)(variable + 0x40) == 5) {
            adios2::core::VariableBase::SetBlockSelection((ulong)variable);
          }
          std::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                    (&local_388,&local_3b8,&local_3a0);
          adios2::core::VariableBase::SetSelection((pair *)variable);
          if (local_388.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_388.second.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_388.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_388.first.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (bVar4) {
          if (2 < verbose) {
            printf("set Step selection: from %lu read %lu steps\n",local_358[0],local_2b8[0]);
          }
          local_388.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x1;
          local_388.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)step;
          adios2::core::VariableBase::SetStepSelection((pair *)variable);
        }
        __new_size = adios2::core::Variable<std::__cxx11::string>::SelectionSize();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&local_3e8,__new_size);
        adios2::core::Engine::Get<std::__cxx11::string>
                  ((Variable *)local_3c0,variable,(Mode)&local_3e8);
        print_dataset(local_3e8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,*(DataType *)(variable + 0x28),
                      local_358,local_2b8,uVar5,local_b8);
        if (0 < (int)uVar5) {
          bVar19 = true;
          lVar10 = (ulong)uVar18 + 1;
          do {
            if (bVar19) {
              uVar17 = (&uStack_240)[lVar10] + (&uStack_140)[lVar10];
              bVar19 = local_2b8[lVar10 + -1] + local_358[lVar10 + -1] == uVar17;
              if (bVar19) {
                local_358[lVar10 + -1] = (&uStack_140)[lVar10];
                uVar16 = (&uStack_1c0)[lVar10];
              }
              else {
                uVar16 = local_358[lVar10 + -1] + (&uStack_1c0)[lVar10];
                local_358[lVar10 + -1] = uVar16;
                if (local_2b8[lVar10 + -1] + uVar16 <= uVar17) goto LAB_00125a32;
                uVar16 = uVar17 - uVar16;
              }
              local_2b8[lVar10 + -1] = uVar16;
            }
            else {
LAB_00125a32:
              bVar19 = false;
            }
            lVar12 = lVar10 + -1;
            bVar2 = 0 < lVar10;
            lVar10 = lVar12;
          } while (lVar12 != 0 && bVar2);
        }
        if (local_3a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3a0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_3b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3b8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar7 = uVar7 + lVar11;
      } while (uVar7 < local_428);
    }
    if (nextcol != 0) {
      fputc(10,outf);
    }
    nextcol = 0;
  }
LAB_00125a99:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3e8);
  return 0;
}

Assistant:

int readVarBlock(core::Engine *fp, core::IO *io, core::Variable<T> *variable, size_t step,
                 size_t blockid, Dims Count, Dims Start)
{
    int i, j;
    uint64_t start_t[MAX_DIMS],
        count_t[MAX_DIMS]; // processed <0 values in start/count
    uint64_t s[MAX_DIMS],
        c[MAX_DIMS]; // for block reading of smaller chunks
    uint64_t nelems; // number of elements to read
    int tidx;
    uint64_t st, ct;
    std::vector<T> dataV;
    uint64_t sum;             // working var to sum up things
    uint64_t maxreadn;        // max number of elements to read once up to a limit
                              // (10MB of data)
    uint64_t actualreadn;     // our decision how much to read at once
    uint64_t readn[MAX_DIMS]; // how big chunk to read in in each dimension?
    bool incdim;              // used in incremental reading in
    int ndigits_dims[32];     // # of digits (to print) of each dimension

    const size_t elemsize = variable->m_ElementSize;
    const int nsteps = (timestep ? 1 : static_cast<int>(variable->GetAvailableStepsCount()));
    const int ndim = static_cast<int>(variable->m_Count.size());
    // create the counter arrays with the appropriate lengths
    // transfer start and count arrays to format dependent arrays

    nelems = 1;
    tidx = 0;

    if (nsteps > 1)
    {
        if (istart[0] < 0) // negative index means last-|index|
            st = nsteps + istart[0];
        else
            st = istart[0];
        if (icount[0] < 0) // negative index means last-|index|+1-start
            ct = nsteps + icount[0] + 1 - st;
        else
            ct = icount[0];

        if (verbose > 2)
            printf("    time: st=%" PRIu64 " ct=%" PRIu64 "\n", st, ct);

        // check if this block falls into the requested time
        if (step < st || step >= st + ct)
            return 0;
        tidx = 1;
    }

    int out_of_bound = 0;
    for (j = 0; j < ndim; j++)
    {
        if (istart[j + tidx] < 0) // negative index means last-|index|
            st = Count[j] + istart[j + tidx];
        else
            st = istart[j + tidx];
        if (icount[j + tidx] < 0) // negative index means last-|index|+1-start
            ct = Count[j] + icount[j + tidx] + 1 - st;
        else
            ct = icount[j + tidx];

        if (st > Count[j])
        {
            out_of_bound = 1;
        }
        else if (ct > Count[j] - st)
        {
            ct = Count[j] - st;
        }
        if (verbose > 2)
            printf("    j=%d, st=%" PRIu64 " ct=%" PRIu64 "\n", j, st, ct);

        start_t[j] = st;
        count_t[j] = ct;
        nelems *= ct;
        if (verbose > 1)
            printf("    s[%d]=%" PRIu64 ", c[%d]=%" PRIu64 ", n=%" PRIu64 "\n", j, start_t[j], j,
                   count_t[j], nelems);
    }

    if (verbose > 1)
    {
        printf(" total size of data to read = %" PRIu64 "\n", nelems * elemsize);
    }

    print_slice_info(variable, false, start_t, count_t, Count);

    if (out_of_bound)
        return 0;

    maxreadn = MAX_BUFFERSIZE / elemsize;
    if (nelems < maxreadn)
        maxreadn = nelems;

    // allocate data array
    // data = (void *)malloc(maxreadn * elemsize + 8); // +8 for just to be
    // sure

    // determine strategy how to read in:
    //  - at once
    //  - loop over 1st dimension
    //  - loop over 1st & 2nd dimension
    //  - etc
    if (verbose > 1)
        printf("Read size strategy:\n");
    sum = (uint64_t)1;
    actualreadn = (uint64_t)1;
    for (i = ndim - 1; i >= 0; i--)
    {
        if (sum >= (uint64_t)maxreadn)
        {
            readn[i] = 1;
        }
        else
        {
            readn[i] = maxreadn / (int)sum; // sum is small for 4 bytes here
            // this may be over the max count for this dimension
            if (readn[i] > count_t[i])
                readn[i] = count_t[i];
        }
        if (verbose > 1)
            printf("    dim %d: read %" PRIu64 " elements\n", i, readn[i]);
        sum = sum * (uint64_t)count_t[i];
        actualreadn = actualreadn * readn[i];
    }
    if (verbose > 1)
        printf("    read %" PRIu64 " elements at once, %" PRIu64 " in total (nelems=%" PRIu64 ")\n",
               actualreadn, sum, nelems);

    // init s and c
    // and calculate ndigits_dims
    for (j = 0; j < ndim; j++)
    {
        s[j] = start_t[j];
        c[j] = readn[j];

        ndigits_dims[j] =
            ndigits(start_t[j] + count_t[j] - 1); // -1: dim=100 results in 2 digits (0..99)
    }

    // read until read all 'nelems' elements
    sum = 0;
    while (sum < nelems)
    {

        // how many elements do we read in next?
        actualreadn = 1;
        for (j = 0; j < ndim; j++)
            actualreadn *= c[j];

        uint64_t startoffset = s[ndim - 1];
        uint64_t tmpprod = c[ndim - 1];
        for (i = ndim - 2; i >= 0; i--)
        {
            startoffset += s[i] * tmpprod;
            tmpprod *= c[i];
        }

        if (verbose > 2)
        {
            printf("adios_read_var name=%s ", variable->m_Name.c_str());
            PRINT_DIMS_UINT64("  start", s, ndim, j);
            PRINT_DIMS_UINT64("  count", c, ndim, j);
            printf("  read %" PRIu64 " elems\n", actualreadn);
        }
        if (verbose > 1)
            printf("    read block %zu from offset %" PRIu64 " nelems %" PRIu64 ")\n", blockid,
                   startoffset, actualreadn);

        // read a slice finally
        Dims startv = helper::Uint64ArrayToSizetVector(ndim, s);
        Dims countv = helper::Uint64ArrayToSizetVector(ndim, c);

        /* In current implementation we read with global selection, so
         * we need to adjust start_t for global offsets here.
         * TODO: this will change in the future to block reading with
         * relative
         * selection
         */
        if (variable->m_ShapeID == ShapeID::GlobalArray)
        {
            for (j = 0; j < ndim; j++)
            {
                startv[j] += Start[j];
            }
        }

        if (verbose > 2)
        {
            printf("set selection: ");
            PRINT_DIMS_SIZET("  start", startv.data(), ndim, j);
            PRINT_DIMS_SIZET("  count", countv.data(), ndim, j);
            printf("\n");
        }

        if (!variable->m_SingleValue)
        {
            if (variable->m_ShapeID == ShapeID::LocalArray)
            {
                variable->SetBlockSelection(blockid);
            }
            variable->SetSelection({startv, countv});
        }

        if (nsteps > 1)
        {
            if (verbose > 2)
            {
                printf("set Step selection: from %" PRIu64 " read %" PRIu64 " steps\n", s[0], c[0]);
            }
            variable->SetStepSelection({step, 1});
        }

        dataV.resize(variable->SelectionSize());
        fp->Get(*variable, dataV, adios2::Mode::Sync);
        // print slice
        print_dataset(dataV.data(), variable->m_Type, s, c, ndim, ndigits_dims);

        // prepare for next read
        sum += actualreadn;
        incdim = true; // largest dim should be increased
        for (j = ndim - 1; j >= 0; j--)
        {
            if (incdim)
            {
                if (s[j] + c[j] == start_t[j] + count_t[j])
                {
                    // reached the end of this dimension
                    s[j] = start_t[j];
                    c[j] = readn[j];
                    incdim = true; // next smaller dim can increase too
                }
                else
                {
                    // move up in this dimension up to total count
                    s[j] += readn[j];
                    if (s[j] + c[j] > start_t[j] + count_t[j])
                    {
                        // do not reach over the limit
                        c[j] = start_t[j] + count_t[j] - s[j];
                    }
                    incdim = false;
                }
            }
        }
    } // end while sum < nelems
    print_endline();
    return 0;
}